

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderBarrier.cpp
# Opt level: O3

int __thiscall
glcts::TessellationShaderBarrierTests::init(TessellationShaderBarrierTests *this,EVP_PKEY_CTX *ctx)

{
  ExtParameters *extParam;
  int extraout_EAX;
  TestCaseBase *pTVar1;
  
  pTVar1 = (TestCaseBase *)operator_new(0x2d8);
  extParam = &(this->super_TestCaseGroupBase).m_extParams;
  TestCaseBase::TestCaseBase
            (pTVar1,(this->super_TestCaseGroupBase).m_context,extParam,"barrier_guarded_read_calls",
             "Verifies invocation A can correctly read a per-vertex and per-patch attribute modified by invocation B after a barrier() call"
            );
  *(undefined8 *)((long)&pTVar1[1].super_TestCase.super_TestNode.m_testCtx + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p + 4) = 0;
  pTVar1[1].super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)0x0;
  pTVar1[1].super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
  (pTVar1->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCaseBase_02111d80
  ;
  *(undefined8 *)((long)&pTVar1[1].super_TestCase.super_TestNode.m_name._M_string_length + 4) =
       0x80000001000;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestCaseBase *)operator_new(0x2d8);
  TestCaseBase::TestCaseBase
            (pTVar1,(this->super_TestCaseGroupBase).m_context,extParam,"barrier_guarded_write_calls"
             ,
             "Verifies it is safe to write to the same per-patch output from multiple TC invocations, as long as each write happens in a separate phase."
            );
  *(undefined8 *)((long)&pTVar1[1].super_TestCase.super_TestNode.m_testCtx + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p + 4) = 0;
  pTVar1[1].super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)0x0;
  pTVar1[1].super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
  (pTVar1->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCaseBase_02111df8
  ;
  *(undefined8 *)((long)&pTVar1[1].super_TestCase.super_TestNode.m_name._M_string_length + 4) =
       0x80000001000;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestCaseBase *)operator_new(0x2e8);
  TestCaseBase::TestCaseBase
            (pTVar1,(this->super_TestCaseGroupBase).m_context,extParam,
             "barrier_guarded_read_write_calls",
             "Verifies it is safe to write to the same per-patch output from multiple TC invocations, as long as each write happens in a separate phase."
            );
  *(undefined8 *)((long)&pTVar1[1].super_TestCase.super_TestNode.m_testCtx + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p + 4) = 0;
  pTVar1[1].super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)0x0;
  pTVar1[1].super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
  (pTVar1->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCaseBase_02111e70
  ;
  *(undefined8 *)((long)&pTVar1[1].super_TestCase.super_TestNode.m_name.field_2 + 0xc) =
       0x28000000002;
  *(undefined8 *)((long)&pTVar1[1].super_TestCase.super_TestNode.m_name._M_string_length + 4) =
       0xa00000500;
  *(undefined8 *)((long)&pTVar1[1].super_TestCase.super_TestNode.m_name.field_2 + 4) = 0x800000010;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  return extraout_EAX;
}

Assistant:

void TessellationShaderBarrierTests::init(void)
{
	addChild(new glcts::TessellationShaderBarrier1(m_context, m_extParams));
	addChild(new glcts::TessellationShaderBarrier2(m_context, m_extParams));
	addChild(new glcts::TessellationShaderBarrier3(m_context, m_extParams));
}